

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

ON_Xform *
ON_Xform::ShearTransformation
          (ON_Xform *__return_storage_ptr__,ON_Plane *plane,ON_3dVector *x1,ON_3dVector *y1,
          ON_3dVector *z1)

{
  ON_Xform local_358;
  ON_Xform local_2d8;
  undefined1 local_258 [8];
  ON_Xform s1;
  ON_Xform s0;
  ON_Xform t1;
  undefined1 local_c0 [8];
  ON_Xform t0;
  ON_3dVector delta;
  ON_3dVector *z1_local;
  ON_3dVector *y1_local;
  ON_3dVector *x1_local;
  ON_Plane *plane_local;
  
  ON_3dPoint::operator-((ON_3dVector *)(t0.m_xform[3] + 3),&plane->origin,&ON_3dPoint::Origin);
  ON_3dVector::operator-((ON_3dVector *)(t1.m_xform[3] + 3),(ON_3dVector *)(t0.m_xform[3] + 3));
  TranslationTransformation((ON_Xform *)local_c0,(ON_3dVector *)(t1.m_xform[3] + 3));
  TranslationTransformation((ON_Xform *)(s0.m_xform[3] + 3),(ON_3dVector *)(t0.m_xform[3] + 3));
  memcpy(s1.m_xform[3] + 3,&IdentityTransformation,0x80);
  memcpy(local_258,&IdentityTransformation,0x80);
  s1.m_xform[3][3] = (plane->xaxis).x;
  s0.m_xform[0][0] = (plane->xaxis).y;
  s0.m_xform[0][1] = (plane->xaxis).z;
  s0.m_xform[0][3] = (plane->yaxis).x;
  s0.m_xform[1][0] = (plane->yaxis).y;
  s0.m_xform[1][1] = (plane->yaxis).z;
  s0.m_xform[1][3] = (plane->zaxis).x;
  s0.m_xform[2][0] = (plane->zaxis).y;
  s0.m_xform[2][1] = (plane->zaxis).z;
  local_258 = (undefined1  [8])x1->x;
  s1.m_xform[0][3] = x1->y;
  s1.m_xform[1][3] = x1->z;
  s1.m_xform[0][0] = y1->x;
  s1.m_xform[1][0] = y1->y;
  s1.m_xform[2][0] = y1->z;
  s1.m_xform[0][1] = z1->x;
  s1.m_xform[1][1] = z1->y;
  s1.m_xform[2][1] = z1->z;
  operator*(&local_358,(ON_Xform *)(s0.m_xform[3] + 3),(ON_Xform *)local_258);
  operator*(&local_2d8,&local_358,(ON_Xform *)(s1.m_xform[3] + 3));
  operator*(__return_storage_ptr__,&local_2d8,(ON_Xform *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform ON_Xform::ShearTransformation(
    const ON_Plane& plane,
    const ON_3dVector& x1,
    const ON_3dVector& y1,
    const ON_3dVector& z1
  )
{
  const ON_3dVector delta = plane.origin - ON_3dPoint::Origin;
  const ON_Xform t0(ON_Xform::TranslationTransformation(-delta));
  const ON_Xform t1(ON_Xform::TranslationTransformation(delta));
  ON_Xform s0(ON_Xform::IdentityTransformation);
  ON_Xform s1(ON_Xform::IdentityTransformation);
  s0.m_xform[0][0] = plane.xaxis.x;
  s0.m_xform[0][1] = plane.xaxis.y;
  s0.m_xform[0][2] = plane.xaxis.z;
  s0.m_xform[1][0] = plane.yaxis.x;
  s0.m_xform[1][1] = plane.yaxis.y;
  s0.m_xform[1][2] = plane.yaxis.z;
  s0.m_xform[2][0] = plane.zaxis.x;
  s0.m_xform[2][1] = plane.zaxis.y;
  s0.m_xform[2][2] = plane.zaxis.z;
  s1.m_xform[0][0] = x1.x;
  s1.m_xform[1][0] = x1.y;
  s1.m_xform[2][0] = x1.z;
  s1.m_xform[0][1] = y1.x;
  s1.m_xform[1][1] = y1.y;
  s1.m_xform[2][1] = y1.z;
  s1.m_xform[0][2] = z1.x;
  s1.m_xform[1][2] = z1.y;
  s1.m_xform[2][2] = z1.z;
  return (t1*s1*s0*t0);
}